

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O3

int64_t GetPredictionCostCrossColorRed
                  (uint32_t *argb,int stride,int tile_width,int tile_height,VP8LMultipliers prev_x,
                  VP8LMultipliers prev_y,int green_to_red,uint32_t *accumulated_red_histo)

{
  uint64_t uVar1;
  int64_t iVar2;
  long lVar3;
  uint32_t local_438 [258];
  
  memset(local_438,0,0x400);
  (*VP8LCollectColorRedTransforms)(argb,stride,tile_width,tile_height,green_to_red,local_438);
  uVar1 = (*VP8LCombinedShannonEntropy)(local_438,accumulated_red_histo);
  iVar2 = PredictionCostBias(local_438,3,0xf0);
  lVar3 = iVar2 + uVar1;
  if ((green_to_red & 0xffU) == ((uint3)prev_x & 0xff)) {
    lVar3 = iVar2 + uVar1 + -0x1800000;
  }
  if ((green_to_red & 0xffU) == ((uint3)prev_y & 0xff)) {
    lVar3 = lVar3 + -0x1800000;
  }
  if (green_to_red == 0) {
    lVar3 = lVar3 + -0x1800000;
  }
  return lVar3;
}

Assistant:

static int64_t GetPredictionCostCrossColorRed(
    const uint32_t* argb, int stride, int tile_width, int tile_height,
    VP8LMultipliers prev_x, VP8LMultipliers prev_y, int green_to_red,
    const uint32_t accumulated_red_histo[256]) {
  uint32_t histo[256] = { 0 };
  int64_t cur_diff;

  VP8LCollectColorRedTransforms(argb, stride, tile_width, tile_height,
                                green_to_red, histo);

  cur_diff = PredictionCostCrossColor(accumulated_red_histo, histo);
  if ((uint8_t)green_to_red == prev_x.green_to_red) {
    // favor keeping the areas locally similar
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  if ((uint8_t)green_to_red == prev_y.green_to_red) {
    // favor keeping the areas locally similar
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  if (green_to_red == 0) {
    cur_diff -= 3ll << LOG_2_PRECISION_BITS;
  }
  return cur_diff;
}